

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<TypePFoo,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypePFoo_::DISABLED_Bar>,_iutest::detail::TypeList1<int>_>
::
EachTest<int,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypePFoo_::DISABLED_Bar>_>
::EachTest(EachTest<int,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypePFoo_::DISABLED_Bar>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *this_00;
  
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_0014bb70;
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = testsuite;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_0014ab98;
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_0014bba8;
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }